

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O3

ggml_cplan *
ggml_graph_plan(ggml_cplan *__return_storage_ptr__,ggml_cgraph *cgraph,int n_threads,
               ggml_threadpool *threadpool)

{
  ggml_op gVar1;
  ggml_type gVar2;
  int iVar3;
  ulong uVar4;
  ggml_tensor *pgVar5;
  char cVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  ggml_tensor *pgVar14;
  int64_t iVar15;
  char *pcVar16;
  int iVar17;
  size_t sVar18;
  undefined8 uVar19;
  long lVar20;
  size_t local_60;
  int local_54;
  int64_t local_50;
  long local_48;
  ggml_threadpool *local_40;
  ggml_cplan *local_38;
  
  if (n_threads < 1) {
    if (threadpool == (ggml_threadpool *)0x0) {
      n_threads = 4;
    }
    else {
      n_threads = threadpool->n_threads_max;
    }
  }
  __return_storage_ptr__->abort_callback_data = (void *)0x0;
  __return_storage_ptr__->work_data = (uint8_t *)0x0;
  *(undefined8 *)&__return_storage_ptr__->n_threads = 0;
  __return_storage_ptr__->threadpool = (ggml_threadpool *)0x0;
  __return_storage_ptr__->abort_callback = (ggml_abort_callback)0x0;
  if (cgraph->n_nodes < 1) {
    iVar17 = 1;
    sVar18 = 0;
  }
  else {
    local_48 = (long)n_threads;
    iVar17 = 1;
    lVar20 = 0;
    uVar10 = 0;
    local_54 = n_threads;
    local_40 = threadpool;
    local_38 = __return_storage_ptr__;
    do {
      pgVar14 = cgraph->nodes[lVar20];
      cVar6 = ggml_is_empty(pgVar14);
      iVar9 = 1;
      if (cVar6 == '\0') {
        iVar9 = local_54;
        switch(pgVar14->op) {
        case GGML_OP_NONE:
        case GGML_OP_SUB:
        case GGML_OP_SQR:
        case GGML_OP_SQRT:
        case GGML_OP_LOG:
        case GGML_OP_SIN:
        case GGML_OP_COS:
        case GGML_OP_SUM:
        case GGML_OP_SUM_ROWS:
        case GGML_OP_MEAN:
        case GGML_OP_ARGMAX:
        case GGML_OP_REPEAT:
        case GGML_OP_REPEAT_BACK:
        case GGML_OP_SCALE:
        case GGML_OP_SET:
        case GGML_OP_RESHAPE:
        case GGML_OP_VIEW:
        case GGML_OP_PERMUTE:
        case GGML_OP_TRANSPOSE:
        case GGML_OP_GET_ROWS:
        case GGML_OP_GET_ROWS_BACK:
        case GGML_OP_DIAG:
        case GGML_OP_CLAMP:
        case GGML_OP_POOL_1D:
        case GGML_OP_POOL_2D:
        case GGML_OP_POOL_2D_BACK:
        case GGML_OP_LEAKY_RELU:
        case GGML_OP_WIN_PART:
        case GGML_OP_WIN_UNPART:
        case GGML_OP_GET_REL_POS:
          iVar9 = 1;
          break;
        case GGML_OP_DUP:
        case GGML_OP_ADD:
        case GGML_OP_ADD1:
        case GGML_OP_ACC:
        case GGML_OP_MUL:
        case GGML_OP_DIV:
        case GGML_OP_COUNT_EQUAL:
        case GGML_OP_CONCAT:
        case GGML_OP_SILU_BACK:
        case GGML_OP_NORM:
        case GGML_OP_RMS_NORM:
        case GGML_OP_RMS_NORM_BACK:
        case GGML_OP_GROUP_NORM:
        case GGML_OP_L2_NORM:
        case GGML_OP_MUL_MAT:
        case GGML_OP_MUL_MAT_ID:
        case GGML_OP_OUT_PROD:
        case GGML_OP_CPY:
        case GGML_OP_CONT:
        case GGML_OP_DIAG_MASK_INF:
        case GGML_OP_DIAG_MASK_ZERO:
        case GGML_OP_SOFT_MAX_BACK:
        case GGML_OP_ROPE:
        case GGML_OP_ROPE_BACK:
        case GGML_OP_CONV_TRANSPOSE_1D:
        case GGML_OP_IM2COL:
        case GGML_OP_IM2COL_BACK:
        case GGML_OP_CONV_2D_DW:
        case GGML_OP_CONV_TRANSPOSE_2D:
        case GGML_OP_UPSCALE:
        case GGML_OP_PAD:
        case GGML_OP_PAD_REFLECT_1D:
        case GGML_OP_ARANGE:
        case GGML_OP_TIMESTEP_EMBEDDING:
        case GGML_OP_ARGSORT:
        case GGML_OP_FLASH_ATTN_EXT:
        case GGML_OP_FLASH_ATTN_BACK:
        case GGML_OP_SSM_CONV:
        case GGML_OP_SSM_SCAN:
        case GGML_OP_ADD_REL_POS:
        case GGML_OP_RWKV_WKV6:
        case GGML_OP_GATED_LINEAR_ATTN:
        case GGML_OP_RWKV_WKV7:
        case GGML_OP_CROSS_ENTROPY_LOSS:
        case GGML_OP_CROSS_ENTROPY_LOSS_BACK:
        case GGML_OP_OPT_STEP_ADAMW:
          break;
        case GGML_OP_SOFT_MAX:
          lVar12 = ggml_nrows(pgVar14->src[0]);
          iVar9 = local_54;
          if (lVar12 <= local_48) {
            iVar9 = ggml_nrows(pgVar14->src[0]);
          }
          break;
        case GGML_OP_UNARY:
          uVar8 = ggml_get_unary_op(pgVar14);
          if (0xd < uVar8) goto LAB_0010d94c;
          iVar9 = 1;
          if ((0x38ffU >> (uVar8 & 0x1f) & 1) == 0) {
            iVar9 = local_54;
          }
          break;
        case GGML_OP_MAP_CUSTOM1:
        case GGML_OP_MAP_CUSTOM2:
        case GGML_OP_MAP_CUSTOM3:
        case GGML_OP_CUSTOM:
          iVar3 = pgVar14->op_params[2];
          if (iVar3 < local_54) {
            iVar9 = iVar3;
          }
          if (iVar3 == -1) {
            iVar9 = local_54;
          }
          break;
        case GGML_OP_COUNT:
          uVar19 = 0x939;
          goto LAB_0010d8cf;
        default:
          ggml_graph_plan_cold_1();
LAB_0010d94c:
          uVar19 = 0x8ac;
          goto LAB_0010d8cf;
        }
      }
      local_60 = 0;
      if (iVar17 <= iVar9) {
        iVar17 = iVar9;
      }
      bVar7 = ggml_cpu_extra_work_size(local_54,pgVar14,&local_60);
      if (!bVar7) {
        gVar1 = pgVar14->op;
        if ((int)gVar1 < 0x2b) {
          if ((int)gVar1 < 0x11) {
            if (gVar1 - GGML_OP_ADD < 2) goto switchD_0010d40c_caseD_1d;
            if (gVar1 == GGML_OP_DUP) goto switchD_0010d40c_caseD_20;
            if ((gVar1 != GGML_OP_ACC) ||
               (cVar6 = ggml_is_quantized(pgVar14->src[0]->type), cVar6 == '\0'))
            goto switchD_0010d40c_caseD_1e;
            lVar12 = ggml_type_size(0);
            pgVar14 = pgVar14->src[1];
LAB_0010d5aa:
            local_60 = iVar9 * lVar12 * pgVar14->ne[0];
          }
          else {
            switch(gVar1) {
            case GGML_OP_MUL_MAT:
              gVar2 = type_traits_cpu[pgVar14->src[0]->type].vec_dot_type;
              if (pgVar14->src[1]->type != gVar2) {
                uVar19 = ggml_nelements();
                local_60 = ggml_row_size(gVar2,uVar19);
              }
              break;
            case GGML_OP_MUL_MAT_ID:
              local_60 = 0;
              pgVar5 = pgVar14->src[2];
              gVar2 = type_traits_cpu[pgVar14->src[0]->type].vec_dot_type;
              iVar15 = pgVar14->src[0]->ne[2];
              if (pgVar14->src[1]->type == gVar2) {
                lVar12 = 0;
              }
              else {
                local_50 = iVar15;
                uVar19 = ggml_nelements();
                lVar12 = ggml_row_size(gVar2,uVar19);
                lVar12 = lVar12 + 8 + local_60;
                iVar15 = local_50;
              }
              iVar9 = (int)iVar15;
              local_60 = (long)(iVar9 << 6) + 0x50 +
                         lVar12 + (long)iVar9 * 8 + (long)iVar9 * 8 * pgVar5->ne[0] * pgVar5->ne[1];
              break;
            case GGML_OP_OUT_PROD:
switchD_0010d40c_caseD_1d:
              cVar6 = ggml_is_quantized(pgVar14->src[0]->type);
              if (cVar6 != '\0') {
                lVar12 = ggml_type_size(0);
                pgVar14 = pgVar14->src[0];
                goto LAB_0010d5aa;
              }
              break;
            case GGML_OP_SCALE:
            case GGML_OP_SET:
              break;
            case GGML_OP_CPY:
switchD_0010d40c_caseD_20:
              cVar6 = ggml_is_quantized(pgVar14->type);
              if (cVar6 == '\0') {
                gVar2 = pgVar14->src[0]->type;
                if (gVar2 == GGML_TYPE_BF16) {
                  if ((pgVar14->src[1] != (ggml_tensor *)0x0) &&
                     (pgVar14->src[1]->type == GGML_TYPE_F16)) goto switchD_0010d46f_caseD_2b;
                }
                else if ((gVar2 == GGML_TYPE_F16) &&
                        ((pgVar14->src[1] != (ggml_tensor *)0x0 &&
                         (pgVar14->src[1]->type == GGML_TYPE_BF16))))
                goto switchD_0010d46f_caseD_2b;
              }
              else {
switchD_0010d46f_caseD_2b:
                lVar12 = ggml_type_size(0);
                local_60 = iVar9 * lVar12 * pgVar14->ne[0];
              }
              break;
            default:
              if (gVar1 == GGML_OP_COUNT_EQUAL) {
                lVar12 = ggml_type_size(pgVar14->type);
LAB_0010d6fb:
                local_60 = iVar9 * lVar12;
              }
            }
          }
        }
        else if ((int)gVar1 < 0x3f) {
          switch(gVar1) {
          case GGML_OP_SOFT_MAX:
          case GGML_OP_ROPE:
          case GGML_OP_ROPE_BACK:
            goto switchD_0010d46f_caseD_2b;
          case GGML_OP_CONV_TRANSPOSE_1D:
            pgVar5 = pgVar14->src[0];
            if (pgVar5->ne[3] != 1) {
              pcVar16 = "node->src[0]->ne[3] == 1";
              uVar19 = 0xaba;
LAB_0010d928:
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                         ,uVar19,"GGML_ASSERT(%s) failed",pcVar16);
            }
            pgVar14 = pgVar14->src[1];
            if (pgVar14->ne[2] != 1) {
              pcVar16 = "node->src[1]->ne[2] == 1";
              uVar19 = 0xabb;
              goto LAB_0010d928;
            }
            if (pgVar14->ne[3] != 1) {
              pcVar16 = "node->src[1]->ne[3] == 1";
              uVar19 = 0xabc;
              goto LAB_0010d928;
            }
            gVar2 = pgVar5->type;
            if (gVar2 == GGML_TYPE_F32) {
              lVar12 = 2;
LAB_0010d79c:
              if (pgVar14->type == GGML_TYPE_F32) {
                local_60 = local_60 +
                           (pgVar14->ne[1] * pgVar14->ne[0] +
                            pgVar5->ne[2] * pgVar5->ne[1] * pgVar5->ne[0] << lVar12);
                break;
              }
            }
            else if ((gVar2 == GGML_TYPE_BF16) || (gVar2 == GGML_TYPE_F16)) {
              lVar12 = 1;
              goto LAB_0010d79c;
            }
            uVar19 = 0xace;
LAB_0010d8cf:
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                       ,uVar19,"fatal error");
          case GGML_OP_CONV_TRANSPOSE_2D:
            pgVar5 = pgVar14->src[0];
            pgVar14 = pgVar14->src[1];
            local_60 = local_60 +
                       (pgVar14->ne[1] * pgVar14->ne[0] * pgVar14->ne[2] +
                       pgVar5->ne[1] * pgVar5->ne[0] * pgVar5->ne[2] * pgVar5->ne[3]) * 2;
          }
        }
        else if ((int)gVar1 < 0x4f) {
          if (gVar1 == GGML_OP_FLASH_ATTN_EXT) {
            lVar12 = pgVar14->src[1]->ne[0] * 4 + pgVar14->src[2]->ne[0] * 8;
            goto LAB_0010d6fb;
          }
          if (gVar1 == GGML_OP_FLASH_ATTN_BACK) {
            uVar4 = pgVar14->src[0]->ne[0];
            gVar2 = pgVar14->src[1]->type;
            uVar11 = (long)((int)pgVar14->src[1]->ne[1] + 3) & 0xfffffffffffffffc;
            if ((long)uVar11 < (long)uVar4) {
              uVar11 = uVar4;
            }
            if (((gVar2 == GGML_TYPE_BF16) || (gVar2 == GGML_TYPE_F16)) || (gVar2 == GGML_TYPE_F32))
            {
              local_60 = (long)iVar9 * uVar11 * 0x10;
            }
          }
        }
        else if (gVar1 == GGML_OP_CROSS_ENTROPY_LOSS) {
          lVar12 = ggml_type_size(pgVar14->type);
          local_60 = iVar9 * lVar12 * (pgVar14->src[0]->ne[0] + 1);
        }
        else if (gVar1 == GGML_OP_COUNT) {
          uVar19 = 0xafd;
          goto LAB_0010d8cf;
        }
      }
switchD_0010d40c_caseD_1e:
      sVar13 = local_60;
      if (local_60 < uVar10) {
        sVar13 = uVar10;
      }
      lVar20 = lVar20 + 1;
      uVar10 = sVar13;
    } while (lVar20 < cgraph->n_nodes);
    sVar18 = (long)(local_54 << 6) + sVar13;
    threadpool = local_40;
    __return_storage_ptr__ = local_38;
    n_threads = local_54;
    if (sVar13 == 0) {
      sVar18 = 0;
    }
  }
  __return_storage_ptr__->threadpool = threadpool;
  if (iVar17 < n_threads) {
    n_threads = iVar17;
  }
  __return_storage_ptr__->n_threads = n_threads;
  __return_storage_ptr__->work_size = sVar18;
  __return_storage_ptr__->work_data = (uint8_t *)0x0;
  return __return_storage_ptr__;
}

Assistant:

struct ggml_cplan ggml_graph_plan(
          const struct ggml_cgraph * cgraph,
                               int   n_threads,
            struct ggml_threadpool * threadpool) {

    if (threadpool == NULL) {
        //GGML_PRINT_DEBUG("Threadpool is not specified. Will create a disposable threadpool : n_threads %d\n", n_threads);
    }
    if (n_threads <= 0) {
        n_threads = threadpool ? threadpool->n_threads_max : GGML_DEFAULT_N_THREADS;
    }

    size_t work_size = 0;

    struct ggml_cplan cplan;
    memset(&cplan, 0, sizeof(struct ggml_cplan));

    int max_tasks = 1;

    // thread scheduling for the different operations + work buffer size estimation
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        const int n_tasks = ggml_get_n_tasks(node, n_threads);

        max_tasks = MAX(max_tasks, n_tasks);

        size_t cur = 0;

        if (!ggml_cpu_extra_work_size(n_threads, node, &cur)) {
            switch (node->op) {
                case GGML_OP_CPY:
                case GGML_OP_DUP:
                    {
                        if (ggml_is_quantized(node->type) ||
                            // F16 -> BF16 and BF16 -> F16 copies go through intermediate F32
                            (node->src[0]->type == GGML_TYPE_F16  && node->src[1] && node->src[1]->type == GGML_TYPE_BF16) ||
                            (node->src[0]->type == GGML_TYPE_BF16 && node->src[1] && node->src[1]->type == GGML_TYPE_F16)) {
                            cur = ggml_type_size(GGML_TYPE_F32) * node->ne[0] * n_tasks;
                        }
                    } break;
                case GGML_OP_ADD:
                case GGML_OP_ADD1:
                    {
                        if (ggml_is_quantized(node->src[0]->type)) {
                            cur = ggml_type_size(GGML_TYPE_F32) * node->src[0]->ne[0] * n_tasks;
                        }
                    } break;
                case GGML_OP_ACC:
                    {
                        if (ggml_is_quantized(node->src[0]->type)) {
                            cur = ggml_type_size(GGML_TYPE_F32) * node->src[1]->ne[0] * n_tasks;
                        }
                    } break;
                case GGML_OP_COUNT_EQUAL:
                    {
                        cur = ggml_type_size(node->type)*n_tasks;
                    } break;
                case GGML_OP_MUL_MAT:
                    {
                        const enum ggml_type vec_dot_type = type_traits_cpu[node->src[0]->type].vec_dot_type;

                        if (node->src[1]->type != vec_dot_type) {
                            cur = ggml_row_size(vec_dot_type, ggml_nelements(node->src[1]));
                        }
                    } break;
                case GGML_OP_MUL_MAT_ID:
                    {
                        cur = 0;
                        const struct ggml_tensor * src0 = node->src[0];
                        const struct ggml_tensor * src1 = node->src[1];
                        const struct ggml_tensor * ids = node->src[2];
                        const enum ggml_type vec_dot_type = type_traits_cpu[src0->type].vec_dot_type;
                        const int n_as = src0->ne[2];
                        // src1
                        if (src1->type != vec_dot_type) {
                            cur += ggml_row_size(vec_dot_type, ggml_nelements(src1)) + sizeof(int64_t);
                        }
                        // matrix_row_counts
                        cur += n_as * sizeof(int64_t) + sizeof(int64_t);
                        // matrix_rows
                        cur += n_as*ids->ne[0]*ids->ne[1]*sizeof(struct mmid_row_mapping) + sizeof(int64_t);
                        // atomic_current_chunk
                        cur += CACHE_LINE_SIZE*n_as + CACHE_LINE_SIZE;
                    } break;
                case GGML_OP_OUT_PROD:
                    {
                        if (ggml_is_quantized(node->src[0]->type)) {
                            cur = ggml_type_size(GGML_TYPE_F32) * node->src[0]->ne[0] * n_tasks;
                        }
                    } break;
                case GGML_OP_SOFT_MAX:
                case GGML_OP_ROPE:
                case GGML_OP_ROPE_BACK:
                    {
                        cur = ggml_type_size(GGML_TYPE_F32) * node->ne[0] * n_tasks;
                    } break;
                case GGML_OP_CONV_TRANSPOSE_1D:
                    {
                        GGML_ASSERT(node->src[0]->ne[3] == 1);
                        GGML_ASSERT(node->src[1]->ne[2] == 1);
                        GGML_ASSERT(node->src[1]->ne[3] == 1);

                        const int64_t ne00 = node->src[0]->ne[0];  // K
                        const int64_t ne01 = node->src[0]->ne[1];  // Cout
                        const int64_t ne02 = node->src[0]->ne[2];  // Cin
                        const int64_t ne10 = node->src[1]->ne[0];  // L
                        const int64_t ne11 = node->src[1]->ne[1];  // Cin

                        if ((node->src[0]->type == GGML_TYPE_F16 ||
                             node->src[0]->type == GGML_TYPE_BF16) &&
                            node->src[1]->type == GGML_TYPE_F32) {
                            cur += sizeof(ggml_fp16_t)*ne00*ne01*ne02;
                            cur += sizeof(ggml_fp16_t)*ne10*ne11;
                        } else if (node->src[0]->type == GGML_TYPE_F32 &&
                                   node->src[1]->type == GGML_TYPE_F32) {
                            cur += sizeof(float)*ne00*ne01*ne02;
                            cur += sizeof(float)*ne10*ne11;
                        } else {
                            GGML_ABORT("fatal error");
                        }
                    } break;
                case GGML_OP_CONV_TRANSPOSE_2D:
                    {
                        const int64_t ne00 = node->src[0]->ne[0]; // W
                        const int64_t ne01 = node->src[0]->ne[1]; // H
                        const int64_t ne02 = node->src[0]->ne[2]; // Channels Out
                        const int64_t ne03 = node->src[0]->ne[3]; // Channels In

                        const int64_t ne10 = node->src[1]->ne[0]; // W
                        const int64_t ne11 = node->src[1]->ne[1]; // H
                        const int64_t ne12 = node->src[1]->ne[2]; // Channels In

                        cur += sizeof(ggml_fp16_t)*ne00*ne01*ne02*ne03;
                        cur += sizeof(ggml_fp16_t)*ne10*ne11*ne12;
                    } break;
                case GGML_OP_FLASH_ATTN_EXT:
                    {
                        const int64_t ne10 = node->src[1]->ne[0]; // DK
                        const int64_t ne20 = node->src[2]->ne[0]; // DV

                        cur = sizeof(float)*(1*ne10 + 2*ne20)*n_tasks; // 1x head size K + 2x head size V (per thread)
                    } break;
                case GGML_OP_FLASH_ATTN_BACK:
                    {
                        const int64_t    D = node->src[0]->ne[0];
                        const int64_t ne11 = ggml_up(node->src[1]->ne[1], GGML_SOFT_MAX_UNROLL);
                        const int64_t mxDn = MAX(D, ne11) * 2; // *2 because of S and SM in ggml_compute_forward_flash_attn_back
                        if (node->src[1]->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*mxDn*n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*mxDn*n_tasks; // this is overestimated by x2
                        } else if (node->src[1]->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*mxDn*n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*mxDn*n_tasks; // this is overestimated by x2
                        } else if (node->src[1]->type == GGML_TYPE_BF16) {
                            cur  = sizeof(float)*mxDn*n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*mxDn*n_tasks; // this is overestimated by x2
                        }
                    } break;

                case GGML_OP_CROSS_ENTROPY_LOSS:
                    {
                        cur = ggml_type_size(node->type)*(n_tasks + node->src[0]->ne[0]*n_tasks);
                    } break;
                case GGML_OP_COUNT:
                    {
                        GGML_ABORT("fatal error");
                    }
                default:
                    break;
            }
        }

        work_size = MAX(work_size, cur);
    }

    if (work_size > 0) {
        work_size += CACHE_LINE_SIZE*(n_threads);
    }

    cplan.threadpool = threadpool;
    cplan.n_threads  = MIN(max_tasks, n_threads);
    cplan.work_size  = work_size;
    cplan.work_data  = NULL;

    return cplan;
}